

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.cpp
# Opt level: O0

void __thiscall n_e_s::core::Ppu::fetch(Ppu *this)

{
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  unsigned_short uVar4;
  uint uVar5;
  int iVar7;
  uint16_t *puVar8;
  uint uVar9;
  ushort uVar10;
  uchar local_23;
  uint16_t local_22;
  short local_20;
  ushort local_1e;
  uint16_t nametable_address_1;
  uint16_t index_1;
  uint16_t index;
  uint8_t coarse_x;
  uint8_t coarse_y;
  uint8_t byte;
  uint16_t attribute_address;
  uint16_t nametable_address;
  uint8_t fine_scroll_y;
  uint16_t background_pattern_table_base_address;
  Ppu *this_local;
  uint uVar6;
  
  _attribute_address = this;
  puVar8 = cycle(this);
  if (((*puVar8 == 0) || (puVar8 = cycle(this), 0x100 < *puVar8)) &&
     ((puVar8 = cycle(this), *puVar8 < 0x141 || (puVar8 = cycle(this), 0x150 < *puVar8)))) {
    puVar8 = cycle(this);
    if ((*puVar8 == 0x151) || (puVar8 = cycle(this), *puVar8 == 0x153)) {
      uVar4 = Register<unsigned_short>::value
                        (&(this->registers_->vram_addr).super_Register<unsigned_short>);
      local_22 = anon_unknown.dwarf_74ce8::get_nametable_address(uVar4);
      iVar7 = (*this->mmu_->_vptr_IMmu[3])(this->mmu_,(ulong)local_22);
      local_23 = (uchar)iVar7;
      std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,&local_23);
    }
  }
  else {
    shift_registers(this);
    bVar2 = Register<unsigned_char>::is_set(&this->registers_->ctrl,4);
    _coarse_y = 0;
    if (bVar2) {
      _coarse_y = 0x1000;
    }
    coarse_x = PpuVram::fine_scroll_y(&this->registers_->vram_addr);
    puVar8 = cycle(this);
    uVar6 = (uint)*puVar8;
    uVar5 = uVar6 - 1;
    if (SBORROW4(uVar6,1)) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    uVar9 = uVar5;
    if ((int)uVar5 < 0) {
      uVar9 = uVar6 + 6;
    }
    switch(uVar5 - (uVar9 & 0xfffffff8)) {
    case 0:
      this->registers_->pattern_table_shifter_low =
           this->registers_->pattern_table_shifter_low & 0xff00 |
           (ushort)this->registers_->pattern_table_latch_low;
      this->registers_->pattern_table_shifter_hi =
           this->registers_->pattern_table_shifter_hi & 0xff00 |
           (ushort)this->registers_->pattern_table_latch_hi;
      uVar10 = 0;
      if ((this->registers_->attribute_table_latch & 1) != 0) {
        uVar10 = 0xff;
      }
      this->registers_->attribute_table_shifter_low =
           this->registers_->attribute_table_shifter_low & 0xff00 | uVar10;
      uVar10 = 0;
      if ((this->registers_->attribute_table_latch & 2) != 0) {
        uVar10 = 0xff;
      }
      this->registers_->attribute_table_shifter_hi =
           this->registers_->attribute_table_shifter_hi & 0xff00 | uVar10;
      this->registers_->name_table = this->registers_->name_table_latch;
      uVar4 = Register<unsigned_short>::value
                        (&(this->registers_->vram_addr).super_Register<unsigned_short>);
      index = anon_unknown.dwarf_74ce8::get_nametable_address(uVar4);
      iVar7 = (*this->mmu_->_vptr_IMmu[3])(this->mmu_,(ulong)index);
      this->registers_->name_table_latch = (uint8_t)iVar7;
      break;
    case 2:
      uVar4 = Register<unsigned_short>::value
                        (&(this->registers_->vram_addr).super_Register<unsigned_short>);
      index_1 = anon_unknown.dwarf_74ce8::get_attribute_address(uVar4);
      iVar7 = (*this->mmu_->_vptr_IMmu[3])(this->mmu_,(ulong)index_1);
      nametable_address_1._1_1_ = (byte)iVar7;
      nametable_address_1._0_1_ = PpuVram::coarse_scroll_y(&this->registers_->vram_addr);
      bVar3 = PpuVram::coarse_scroll_x(&this->registers_->vram_addr);
      if (1 < ((byte)nametable_address_1 & 3)) {
        nametable_address_1._1_1_ = (byte)((int)(uint)nametable_address_1._1_1_ >> 4);
      }
      if (1 < (bVar3 & 3)) {
        nametable_address_1._1_1_ = (byte)((int)(uint)nametable_address_1._1_1_ >> 2);
      }
      this->registers_->attribute_table_latch = nametable_address_1._1_1_ & 3;
      break;
    case 4:
      uVar5 = (uint)_coarse_y + (uint)this->registers_->name_table_latch * 0x10 + (uint)coarse_x;
      local_1e = (ushort)uVar5;
      iVar7 = (*this->mmu_->_vptr_IMmu[3])(this->mmu_,(ulong)local_1e,(ulong)coarse_x,(ulong)uVar5);
      this->registers_->pattern_table_latch_low = (uint8_t)iVar7;
      break;
    case 6:
      iVar7 = (uint)_coarse_y + (uint)this->registers_->name_table_latch * 0x10 + (uint)coarse_x;
      local_20 = (short)iVar7;
      iVar7 = (*this->mmu_->_vptr_IMmu[3])
                        (this->mmu_,(ulong)(ushort)(local_20 + 8U),(ulong)coarse_x,
                         (ulong)CONCAT22((short)((uint)iVar7 >> 0x10),local_20 + 8U));
      this->registers_->pattern_table_latch_hi = (uint8_t)iVar7;
    }
  }
  return;
}

Assistant:

void Ppu::fetch() {
    if ((cycle() >= 1 && cycle() <= 256) ||
            (cycle() >= 321 && cycle() <= 336)) {
        shift_registers();
        const uint16_t background_pattern_table_base_address =
                registers_->ctrl.is_set(4u) ? 0x1000u : 0x0000u;
        const uint8_t fine_scroll_y = registers_->vram_addr.fine_scroll_y();

        switch ((cycle() - 1) % 8) {
        case 0: {
            registers_->pattern_table_shifter_low =
                    (registers_->pattern_table_shifter_low & 0xFF00u) |
                    registers_->pattern_table_latch_low;
            registers_->pattern_table_shifter_hi =
                    (registers_->pattern_table_shifter_hi & 0xFF00u) |
                    registers_->pattern_table_latch_hi;

            registers_->attribute_table_shifter_low =
                    (registers_->attribute_table_shifter_low & 0xFF00u) |
                    ((registers_->attribute_table_latch & 0b01u) ? 0xFFu
                                                                 : 0x00u);
            registers_->attribute_table_shifter_hi =
                    (registers_->attribute_table_shifter_hi & 0xFF00u) |
                    ((registers_->attribute_table_latch & 0b10u) ? 0xFFu
                                                                 : 0x00u);

            registers_->name_table = registers_->name_table_latch;
            const uint16_t nametable_address =
                    get_nametable_address(registers_->vram_addr.value());
            registers_->name_table_latch = mmu_->read_byte(nametable_address);
            break;
        }
        case 2: {
            const uint16_t attribute_address =
                    get_attribute_address(registers_->vram_addr.value());
            uint8_t byte = mmu_->read_byte(attribute_address);
            // Figure out which quadrant we are in and get the two corresponding
            // bits.
            // 7654 3210
            // |||| ||++- Color bits 3-2 for top left quadrant of this byte
            // |||| ++--- Color bits 3-2 for top right quadrant of this byte
            // ||++------ Color bits 3-2 for bottom left quadrant of this byte
            // ++-------- Color bits 3-2 for bottom right quadrant of this byte
            const uint8_t coarse_y = registers_->vram_addr.coarse_scroll_y();
            const uint8_t coarse_x = registers_->vram_addr.coarse_scroll_x();
            if (coarse_y % 4u >= 2u) {
                // We are in the bottom quadrant
                byte >>= 4u;
            }
            if (coarse_x % 4u >= 2u) {
                // We are in the right quadrant
                byte >>= 2u;
            }
            byte &= 0x0000'0003u;
            registers_->attribute_table_latch = byte;
            break;
        }
        case 4: {
            const uint16_t index = background_pattern_table_base_address +
                                   (registers_->name_table_latch * 16u) +
                                   fine_scroll_y;
            registers_->pattern_table_latch_low = mmu_->read_byte(index);
            break;
        }
        case 6: {
            const uint16_t index = background_pattern_table_base_address +
                                   (registers_->name_table_latch * 16u) +
                                   fine_scroll_y;
            // +8 for next bit plane
            registers_->pattern_table_latch_hi = mmu_->read_byte(index + 0x8u);
            break;
        }
        };
    } else if (cycle() == 337 || cycle() == 339) {
        // Unused fetches. Uses the same nametable address as will be fetched
        // at the beginning of the next scanline (tile 3 since tile 1 and 2
        // were fetched already in the end of this scanline).
        const uint16_t nametable_address =
                get_nametable_address(registers_->vram_addr.value());
        std::ignore = mmu_->read_byte(nametable_address);
    }
}